

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O2

void __thiscall neueda::cdr::cdr(cdr *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_cdr = (_func_int **)&PTR__cdr_0010eda8;
  this->mNextIndex = 0;
  p_Var1 = &(this->mOrdered)._M_t._M_impl.super__Rb_tree_header;
  (this->mOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mOrdered)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mItems)._M_t._M_impl.super__Rb_tree_header;
  (this->mItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

cdr::cdr () :
    mNextIndex (0)
{
}